

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rexchange.cpp
# Opt level: O2

void remote_deq(Block *param_1,ProxyWithLink *cp,int nblocks)

{
  MemoryBuffer *pMVar1;
  ulong uVar2;
  long lVar3;
  int recvd_data;
  int received;
  AssertionHandler local_d0;
  int local_84;
  int local_80;
  int local_7c;
  vector<int,_std::allocator<int>_> incoming_gids;
  undefined **local_60;
  undefined1 local_58;
  undefined1 local_57;
  int *local_50;
  char *local_48;
  undefined8 local_40;
  int *local_38;
  
  incoming_gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  incoming_gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  incoming_gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_84 = nblocks;
  diy::Master::Proxy::incoming(&cp->super_Proxy,&incoming_gids);
  received = 0;
  lVar3 = 0;
  for (uVar2 = 0;
      uVar2 < (ulong)((long)incoming_gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)incoming_gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar2 = uVar2 + 1) {
    pMVar1 = diy::Master::Proxy::incoming
                       (&cp->super_Proxy,
                        *(int *)((long)incoming_gids.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar3));
    if ((pMVar1->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (pMVar1->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      received = received + 1;
      diy::Master::Proxy::dequeue<int>
                (&cp->super_Proxy,
                 *(int *)((long)incoming_gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start + lVar3),&recvd_data,1,
                 diy::load<int>);
      local_d0.m_assertionInfo.macroName.m_start =
           (char *)CONCAT44(local_d0.m_assertionInfo.macroName.m_start._4_4_,(cp->super_Proxy).gid_)
      ;
      fmt::v7::print<char[54],int,int&,int&,char>
                (_stderr,(char (*) [54])"Remote dequeue: gid {} received value {} from gid {}\n",
                 (int *)&local_d0,&recvd_data,
                 (int *)((long)incoming_gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar3));
      local_d0.m_assertionInfo.macroName.m_start = "CHECK";
      local_d0.m_assertionInfo.macroName.m_size = 5;
      local_d0.m_assertionInfo.lineInfo.file =
           "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/rexchange.cpp";
      local_d0.m_assertionInfo.lineInfo.line = 0x5f;
      local_d0.m_assertionInfo.capturedExpression.m_start = "recvd_data == incoming_gids[i]";
      local_d0.m_assertionInfo.capturedExpression.m_size = 0x1e;
      local_d0.m_assertionInfo.resultDisposition = ContinueOnFailure;
      local_d0.m_reaction.shouldDebugBreak = false;
      local_d0.m_reaction.shouldThrow = false;
      local_d0.m_completed = false;
      local_d0.m_resultCapture = Catch::getResultCapture();
      local_57 = recvd_data ==
                 *(int *)((long)incoming_gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start + lVar3);
      local_58 = 1;
      local_38 = (int *)((long)incoming_gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar3);
      local_60 = &PTR_streamReconstructedExpression_001ba8f8;
      local_48 = "==";
      local_40 = 2;
      local_50 = &recvd_data;
      (*(local_d0.m_resultCapture)->_vptr_IResultCapture[10])
                (local_d0.m_resultCapture,&local_d0,&local_60,&local_d0.m_reaction);
      Catch::AssertionHandler::complete(&local_d0);
      Catch::AssertionHandler::~AssertionHandler(&local_d0);
      local_d0.m_assertionInfo.macroName.m_start = "CHECK";
      local_d0.m_assertionInfo.macroName.m_size = 5;
      local_d0.m_assertionInfo.lineInfo.file =
           "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/rexchange.cpp";
      local_d0.m_assertionInfo.lineInfo.line = 0x60;
      local_d0.m_assertionInfo.capturedExpression.m_start = "(recvd_data + 2) % nblocks == cp.gid()"
      ;
      local_d0.m_assertionInfo.capturedExpression.m_size = 0x26;
      local_d0.m_assertionInfo.resultDisposition = ContinueOnFailure;
      local_d0.m_reaction.shouldDebugBreak = false;
      local_d0.m_reaction.shouldThrow = false;
      local_d0.m_completed = false;
      local_d0.m_resultCapture = Catch::getResultCapture();
      local_7c = (recvd_data + 2) % local_84;
      local_80 = (cp->super_Proxy).gid_;
      local_57 = local_7c == local_80;
      local_58 = 1;
      local_60 = &PTR_streamReconstructedExpression_001ba8f8;
      local_50 = &local_7c;
      local_48 = "==";
      local_40 = 2;
      local_38 = &local_80;
      (*(local_d0.m_resultCapture)->_vptr_IResultCapture[10])
                (local_d0.m_resultCapture,&local_d0,&local_60,&local_d0.m_reaction);
      Catch::AssertionHandler::complete(&local_d0);
      Catch::AssertionHandler::~AssertionHandler(&local_d0);
    }
    lVar3 = lVar3 + 4;
  }
  local_d0.m_assertionInfo.macroName.m_start = "CHECK";
  local_d0.m_assertionInfo.macroName.m_size = 5;
  local_d0.m_assertionInfo.lineInfo.file =
       "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/rexchange.cpp";
  local_d0.m_assertionInfo.lineInfo.line = 0x62;
  local_d0.m_assertionInfo.capturedExpression.m_start = "received == 1";
  local_d0.m_assertionInfo.capturedExpression.m_size = 0xd;
  local_d0.m_assertionInfo.resultDisposition = ContinueOnFailure;
  local_d0.m_reaction.shouldDebugBreak = false;
  local_d0.m_reaction.shouldThrow = false;
  local_d0.m_completed = false;
  local_d0.m_resultCapture = Catch::getResultCapture();
  local_50 = &received;
  local_57 = received == 1;
  local_58 = 1;
  recvd_data = 1;
  local_60 = &PTR_streamReconstructedExpression_001ba8f8;
  local_48 = "==";
  local_40 = 2;
  local_38 = &recvd_data;
  (*(local_d0.m_resultCapture)->_vptr_IResultCapture[10])(local_d0.m_resultCapture,&local_d0);
  Catch::AssertionHandler::complete(&local_d0);
  Catch::AssertionHandler::~AssertionHandler(&local_d0);
  Catch::clara::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&incoming_gids.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void remote_deq(Block*,
                const diy::Master::ProxyWithLink&   cp,
                int                                 nblocks)       // only need nblocks for testing
{
    std::vector<int> incoming_gids;
    cp.incoming(incoming_gids);
    int received = 0;
    for (size_t i = 0; i < incoming_gids.size(); i++)
        if (cp.incoming(incoming_gids[i]).size())
        {
            ++received;
            int recvd_data;
            // same as cp.dequeue(incoming_gids[i], recvd_data), but using this variant for
            // testing coverage.
            cp.dequeue(incoming_gids[i], &recvd_data, 1);
            fmt::print(stderr, "Remote dequeue: gid {} received value {} from gid {}\n",
                    cp.gid(), recvd_data, incoming_gids[i]);
            CHECK(recvd_data == incoming_gids[i]);
            CHECK((recvd_data + 2) % nblocks == cp.gid());
        }
    CHECK(received == 1);
}